

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O0

bool __thiscall DyndepParser::ParseDyndepVersion(DyndepParser *this,string *err)

{
  pointer *key;
  bool bVar1;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  int local_b8;
  int local_b4;
  int minor;
  int major;
  string version;
  string local_88;
  undefined4 local_68;
  undefined1 local_58 [8];
  EvalString let_value;
  string name;
  string *err_local;
  DyndepParser *this_local;
  
  key = &let_value.parsed_.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)key);
  EvalString::EvalString((EvalString *)local_58);
  bVar1 = ParseLet(this,(string *)key,(EvalString *)local_58,err);
  if (bVar1) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &let_value.parsed_.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            "ninja_dyndep_version");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"expected \'ninja_dyndep_version = ...\'",
                 (allocator<char> *)(version.field_2._M_local_buf + 0xf));
      this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_88,err);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)(version.field_2._M_local_buf + 0xf));
      local_68 = 1;
    }
    else {
      EvalString::Evaluate_abi_cxx11_
                ((string *)&minor,(EvalString *)local_58,&(this->env_).super_Env);
      ParseVersion((string *)&minor,&local_b4,&local_b8);
      if ((local_b4 == 1) && (local_b8 == 0)) {
        this_local._7_1_ = true;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"unsupported \'ninja_dyndep_version = ",&local_119);
        std::operator+(&local_f8,&local_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&minor);
        std::operator+(&local_d8,&local_f8,"\'");
        this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_d8,err);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator(&local_119);
      }
      local_68 = 1;
      std::__cxx11::string::~string((string *)&minor);
    }
  }
  else {
    this_local._7_1_ = false;
    local_68 = 1;
  }
  EvalString::~EvalString((EvalString *)local_58);
  std::__cxx11::string::~string
            ((string *)
             &let_value.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local._7_1_;
}

Assistant:

bool DyndepParser::ParseDyndepVersion(string* err) {
  string name;
  EvalString let_value;
  if (!ParseLet(&name, &let_value, err))
    return false;
  if (name != "ninja_dyndep_version") {
    return lexer_.Error("expected 'ninja_dyndep_version = ...'", err);
  }
  string version = let_value.Evaluate(&env_);
  int major, minor;
  ParseVersion(version, &major, &minor);
  if (major != 1 || minor != 0) {
    return lexer_.Error(
      string("unsupported 'ninja_dyndep_version = ") + version + "'", err);
    return false;
  }
  return true;
}